

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::unsimplify
          (SPxMainSM<double> *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s
          ,VectorBase<double> *r,VarStatus *rows,VarStatus *cols,bool isOptimal)

{
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *this_00;
  double dVar1;
  SPxOut *pSVar2;
  long *plVar3;
  char cVar4;
  pointer pdVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  Verbosity old_verbosity;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *local_68;
  VectorBase<double> *local_60;
  VectorBase<double> *local_58;
  
  pSVar2 = (this->super_SPxSimplifier<double>).spxout;
  if ((pSVar2 != (SPxOut *)0x0) && (2 < (int)pSVar2->m_verbosity)) {
    old_verbosity = pSVar2->m_verbosity;
    (*pSVar2->_vptr_SPxOut[2])();
    pSVar2 = (this->super_SPxSimplifier<double>).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar2->m_streams[pSVar2->m_verbosity]," --- unsimplifying solution and basis",0x25);
    cVar4 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18) +
                    cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    pSVar2 = (this->super_SPxSimplifier<double>).spxout;
    (*pSVar2->_vptr_SPxOut[2])(pSVar2,&old_verbosity);
  }
  pdVar5 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pdVar5) >> 3)) {
    lVar8 = 0;
    do {
      dVar1 = pdVar5[lVar8];
      dVar10 = epsZero(this);
      dVar11 = 0.0;
      if (dVar10 < ABS(dVar1)) {
        dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
      }
      (this->m_prim).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar8] = dVar11;
      dVar1 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      dVar10 = epsZero(this);
      dVar11 = 0.0;
      if ((dVar10 < ABS(dVar1)) &&
         (dVar11 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8], this->m_thesense == MAXIMIZE)) {
        dVar11 = -dVar11;
      }
      (this->m_redCost).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar8] = dVar11;
      (this->m_cBasisStat).data[lVar8] = cols[lVar8];
      lVar8 = lVar8 + 1;
      pdVar5 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar8 < (int)((ulong)((long)(x->val).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)pdVar5) >> 3));
  }
  pdVar5 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pdVar5) >> 3)) {
    lVar8 = 0;
    do {
      dVar1 = pdVar5[lVar8];
      dVar10 = epsZero(this);
      dVar11 = 0.0;
      if ((dVar10 < ABS(dVar1)) &&
         (dVar11 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8], this->m_thesense == MAXIMIZE)) {
        dVar11 = -dVar11;
      }
      (this->m_dual).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar8] = dVar11;
      dVar1 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      dVar10 = epsZero(this);
      dVar11 = 0.0;
      if (dVar10 < ABS(dVar1)) {
        dVar11 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
      }
      (this->m_slack).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar8] = dVar11;
      (this->m_rBasisStat).data[lVar8] = rows[lVar8];
      lVar8 = lVar8 + 1;
      pdVar5 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar8 < (int)((ulong)((long)(y->val).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)pdVar5) >> 3));
  }
  this_00 = &this->m_hist;
  uVar6 = (uint)((ulong)((long)(this->m_hist).data.
                               super__Vector_base<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_hist).data.
                              super__Vector_base<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (0 < (int)uVar6) {
    local_58 = &this->m_slack;
    local_60 = &this->m_redCost;
    local_68 = &this->m_cBasisStat;
    uVar7 = (ulong)(uVar6 & 0x7fffffff);
    lVar8 = uVar7 + 1;
    lVar9 = uVar7 << 4;
    do {
      (**(code **)(**(long **)((long)&(this_00->data).
                                      super__Vector_base<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-1].
                                      super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar9) + 0x10))();
      plVar3 = *(long **)((long)&(this_00->data).
                                 super__Vector_base<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].
                                 super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar9);
      (**(code **)(*plVar3 + 0x20))
                (plVar3,&this->m_prim,&this->m_dual,local_58,local_60,local_68,&this->m_rBasisStat,
                 isOptimal);
      std::
      vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
      ::resize(&this_00->data,lVar8 - 2);
      lVar8 = lVar8 + -1;
      lVar9 = lVar9 + -0x10;
    } while (1 < lVar8);
  }
  if (this->m_thesense == MAXIMIZE) {
    pdVar5 = (this->m_redCost).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (uint)((ulong)((long)(this->m_redCost).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar5) >> 3);
    if (0 < (int)uVar6) {
      uVar7 = 0;
      do {
        pdVar5[uVar7] = -pdVar5[uVar7];
        uVar7 = uVar7 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar7);
    }
    pdVar5 = (this->m_dual).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (uint)((ulong)((long)(this->m_dual).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar5) >> 3);
    if (0 < (int)uVar6) {
      uVar7 = 0;
      do {
        pdVar5[uVar7] = -pdVar5[uVar7];
        uVar7 = uVar7 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar7);
    }
  }
  if (0 < this->m_addedcols) {
    VectorBase<double>::reDim
              (&this->m_prim,
               (int)((ulong)((long)(this->m_prim).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->m_prim).val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3) - this->m_addedcols,true);
    VectorBase<double>::reDim
              (&this->m_redCost,
               (int)((ulong)((long)(this->m_redCost).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->m_redCost).val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3) - this->m_addedcols,true);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              (&this->m_cBasisStat,(this->m_cBasisStat).thesize - this->m_addedcols);
    DataArray<int>::reSize(&this->m_cIdx,(this->m_cIdx).thesize - this->m_addedcols);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
  ::clear(&this_00->data);
  this->m_postsolved = true;
  return;
}

Assistant:

void SPxMainSM<R>::unsimplify(const VectorBase<R>& x, const VectorBase<R>& y,
                              const VectorBase<R>& s, const VectorBase<R>& r,
                              const typename SPxSolverBase<R>::VarStatus rows[],
                              const typename SPxSolverBase<R>::VarStatus cols[], bool isOptimal)
{
   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- unsimplifying solution and basis" << std::endl;)
   assert(x.dim() <= m_prim.dim());
   assert(y.dim() <= m_dual.dim());
   assert(x.dim() == r.dim());
   assert(y.dim() == s.dim());

   // assign values of variables in reduced LP
   // NOTE: for maximization problems, we have to switch signs of dual and reduced cost values,
   // since simplifier assumes minimization problem
   for(int j = 0; j < x.dim(); ++j)
   {
      m_prim[j] = isZero(x[j], this->epsZero()) ? 0.0 : x[j];
      m_redCost[j] = isZero(r[j], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -r[j] :
                     r[j]);
      m_cBasisStat[j] = cols[j];
   }

   for(int i = 0; i < y.dim(); ++i)
   {
      m_dual[i] = isZero(y[i], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -y[i] :
                  y[i]);
      m_slack[i] = isZero(s[i], this->epsZero()) ? 0.0 : s[i];
      m_rBasisStat[i] = rows[i];
   }

   // undo preprocessing
   for(int k = m_hist.size() - 1; k >= 0; --k)
   {
      SPxOut::debug(this, "unsimplifying {} \n", m_hist[k]->getName());

      try
      {
         m_hist[k]->execute(m_prim, m_dual, m_slack, m_redCost, m_cBasisStat, m_rBasisStat, isOptimal);
      }
      catch(const SPxException& ex)
      {
         SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Exception thrown while unsimplifying " <<
                       m_hist[k]->getName() << ":\n" << ex.what() << "\n");
         throw SPxInternalCodeException("XMAISM00 Exception thrown during unsimply().");
      }

      m_hist.reSize(k);
   }

   // for maximization problems, we have to switch signs of dual and reduced cost values back
   if(m_thesense == SPxLPBase<R>::MAXIMIZE)
   {
      for(int j = 0; j < m_redCost.dim(); ++j)
         m_redCost[j] = -m_redCost[j];

      for(int i = 0; i < m_dual.dim(); ++i)
         m_dual[i] = -m_dual[i];
   }

   if(m_addedcols > 0)
   {
      assert(m_prim.dim() >= m_addedcols);
      m_prim.reDim(m_prim.dim() - m_addedcols);
      m_redCost.reDim(m_redCost.dim() - m_addedcols);
      m_cBasisStat.reSize(m_cBasisStat.size() - m_addedcols);
      m_cIdx.reSize(m_cIdx.size() - m_addedcols);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM
   int numBasis = 0;

   for(int rs = 0; rs < m_rBasisStat.size(); ++rs)
   {
      if(m_rBasisStat[rs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   for(int cs = 0; cs < m_cBasisStat.size(); ++cs)
   {
      if(m_cBasisStat[cs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   if(numBasis != m_rBasisStat.size())
   {
      throw SPxInternalCodeException("XMAISM26 Dimension doesn't match after this step.");
   }

#endif

   m_hist.clear();
   m_postsolved = true;
}